

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

bool __thiscall
ctemplate::VariableTemplateNode::Expand
          (VariableTemplateNode *this,ExpandEmitter *output_buffer,
          TemplateDictionaryInterface *dictionary,PerExpandData *per_expand_data,
          TemplateCache *cache)

{
  TemplateDictionaryInterface *pTVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  TemplateAnnotator *pTVar5;
  undefined1 local_80 [8];
  TemplateString value;
  TemplateCache *local_30;
  TemplateCache *cache_local;
  PerExpandData *per_expand_data_local;
  TemplateDictionaryInterface *dictionary_local;
  ExpandEmitter *output_buffer_local;
  VariableTemplateNode *this_local;
  
  local_30 = cache;
  cache_local = (TemplateCache *)per_expand_data;
  per_expand_data_local = (PerExpandData *)dictionary;
  dictionary_local = (TemplateDictionaryInterface *)output_buffer;
  output_buffer_local = (ExpandEmitter *)this;
  bVar2 = PerExpandData::annotate(per_expand_data);
  if (bVar2) {
    pTVar5 = PerExpandData::annotator((PerExpandData *)cache_local);
    pTVar1 = dictionary_local;
    TemplateToken::ToString_abi_cxx11_((TemplateToken *)&stack0xffffffffffffffb0);
    (*pTVar5->_vptr_TemplateAnnotator[8])(pTVar5,pTVar1,(TemplateToken *)&stack0xffffffffffffffb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  (**(code **)(per_expand_data_local->annotate_path_ + 0x10))
            (local_80,per_expand_data_local,&this->variable_);
  bVar2 = AnyMightModify(&(this->token_).modvals,(PerExpandData *)cache_local);
  pTVar1 = dictionary_local;
  if (bVar2) {
    pcVar3 = TemplateString::data((TemplateString *)local_80);
    sVar4 = TemplateString::size((TemplateString *)local_80);
    EmitModifiedString(&(this->token_).modvals,pcVar3,sVar4,(PerExpandData *)cache_local,
                       (ExpandEmitter *)dictionary_local);
  }
  else {
    pcVar3 = TemplateString::data((TemplateString *)local_80);
    sVar4 = TemplateString::size((TemplateString *)local_80);
    (*pTVar1->_vptr_TemplateDictionaryInterface[5])(pTVar1,pcVar3,sVar4);
  }
  bVar2 = PerExpandData::annotate((PerExpandData *)cache_local);
  if (bVar2) {
    pTVar5 = PerExpandData::annotator((PerExpandData *)cache_local);
    (*pTVar5->_vptr_TemplateAnnotator[9])(pTVar5,dictionary_local);
  }
  return true;
}

Assistant:

bool VariableTemplateNode::Expand(ExpandEmitter *output_buffer,
                                  const TemplateDictionaryInterface *dictionary,
                                  PerExpandData* per_expand_data,
                                  const TemplateCache *cache) const {
  if (per_expand_data->annotate()) {
    per_expand_data->annotator()->EmitOpenVariable(output_buffer,
                                                   token_.ToString());
  }

  const TemplateString value = dictionary->GetValue(variable_);

  if (AnyMightModify(token_.modvals, per_expand_data)) {
    EmitModifiedString(token_.modvals, value.data(), value.size(),
                       per_expand_data, output_buffer);
  } else {
    // No need to modify value, so just emit it.
    output_buffer->Emit(value.data(), value.size());
  }

  if (per_expand_data->annotate()) {
    per_expand_data->annotator()->EmitCloseVariable(output_buffer);
  }

  return true;
}